

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O1

bool __thiscall
draco::PredictionSchemeNormalOctahedronDecodingTransform<int>::DecodeTransformData
          (PredictionSchemeNormalOctahedronDecodingTransform<int> *this,DecoderBuffer *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  lVar4 = buffer->pos_ + 4;
  if (lVar4 <= buffer->data_size_) {
    uVar1 = *(uint *)(buffer->data_ + buffer->pos_);
    buffer->pos_ = lVar4;
    if (buffer->bitstream_version_ < 0x202) {
      lVar4 = buffer->pos_ + 4;
      if (buffer->data_size_ < lVar4) {
        return false;
      }
      buffer->pos_ = lVar4;
    }
    if ((uVar1 & 1) != 0) {
      uVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
      bVar5 = uVar2 - 2 < 0x1d;
      if (bVar5) {
        uVar3 = -1 << (-(char)uVar2 & 0x1fU);
        (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
        quantization_bits_ = 0x20 - uVar2;
        uVar1 = -uVar3 - 2;
        (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
        max_quantized_value_ = ~uVar3;
        (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
        max_value_ = uVar1;
        (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
        dequantization_scale_ = 2.0 / (float)(int)uVar1;
        (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
        center_value_ = uVar1 >> 1;
        return true;
      }
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool Peek(T *out_val) {
    const size_t size_to_decode = sizeof(T);
    if (data_size_ < static_cast<int64_t>(pos_ + size_to_decode)) {
      return false;  // Buffer overflow.
    }
    memcpy(out_val, (data_ + pos_), size_to_decode);
    return true;
  }